

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMem.c
# Opt level: O2

Gia_MmFlex_t * Gia_MmFlexStart(void)

{
  Gia_MmFlex_t *pGVar1;
  char **ppcVar2;
  
  pGVar1 = (Gia_MmFlex_t *)calloc(1,0x38);
  pGVar1->nChunkSize = 0x40000;
  pGVar1->nChunksAlloc = 0x40;
  ppcVar2 = (char **)malloc(0x200);
  pGVar1->pChunks = ppcVar2;
  return pGVar1;
}

Assistant:

Gia_MmFlex_t * Gia_MmFlexStart()
{
    Gia_MmFlex_t * p;

    p = ABC_ALLOC( Gia_MmFlex_t, 1 );
    memset( p, 0, sizeof(Gia_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 18);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}